

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O2

void __thiscall Group::Group(Group *this)

{
  int iVar1;
  
  iVar1 = counter + 1;
  this->id = counter;
  counter = iVar1;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->subjects).super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subjects).super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subjects).super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Group() : id(counter++) {}